

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Int64Range *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Int64Range>(Arena *arena)

{
  Int64Range *pIVar1;
  
  if (arena != (Arena *)0x0) {
    pIVar1 = DoCreateMessage<CoreML::Specification::Int64Range>(arena);
    return pIVar1;
  }
  pIVar1 = (Int64Range *)operator_new(0x28);
  CoreML::Specification::Int64Range::Int64Range(pIVar1,(Arena *)0x0,false);
  return pIVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }